

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall
CLParam<double>::CLParam(CLParam<double> *this,string *param_name,string *info,double default_val)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  undefined1 *puVar4;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_type in_XMM0_Qa;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_name_split;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  size_type *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_50 [48];
  size_type local_20;
  string *local_18;
  
  *(undefined ***)in_RDI = &PTR__CLParam_0017b630;
  this_00 = &in_RDI->_M_string_length;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)this_00,in_RSI);
  *(undefined1 *)&in_RDI[1]._M_string_length = 0;
  std::__cxx11::string::string((string *)in_RDI[1].field_2._M_local_buf,local_18);
  in_RDI[2].field_2._M_allocated_capacity = local_20;
  *(size_type *)((long)&in_RDI[2].field_2 + 8) = local_20;
  in_RDI[3]._M_dataplus = (_Alloc_hider)0x0;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::__cxx11::string::operator=((string *)in_RDI[1].field_2._M_local_buf,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  }
  CLOptionsHelper::split(in_RDI,(char)((ulong)this_00 >> 0x38));
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_88);
  if (sVar2 == 2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_88,0);
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)pvVar3);
    *(undefined1 *)&in_RDI[1]._M_string_length = *puVar4;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_88,1);
    std::__cxx11::string::operator=((string *)&in_RDI->_M_string_length,(string *)pvVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  return;
}

Assistant:

CLParam<T>(const std::string& param_name,
               const std::string& info,
               T default_val) :
        parameter_name(param_name), description(info),
        value(default_val), default_value(default_val),
        is_set(false)
    {
        if (description.empty()) description="No description for " + parameter_name + ". I guess you're on your own.";
        std::vector<std::string> param_name_split = CLOptionsHelper::split(param_name, ',') ;
        if (param_name_split.size() == 2) {
            parameter_name_short = param_name_split[0][0] ;
            parameter_name = param_name_split[1] ;
        }
    }